

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O3

void __thiscall Dumper::dumpToTty(Dumper *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint *puVar3;
  uint *puVar4;
  RWNode *pRVar5;
  long *plVar6;
  undefined8 *puVar7;
  long lVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  undefined8 *local_48;
  undefined8 *local_40;
  long local_38;
  
  lVar8 = *(long *)(this->DDA->DDA)._M_t.
                   super___uniq_ptr_impl<dg::dda::DataDependenceAnalysis,_std::default_delete<dg::dda::DataDependenceAnalysis>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_dg::dda::DataDependenceAnalysis_*,_std::default_delete<dg::dda::DataDependenceAnalysis>_>
                   .super__Head_base<0UL,_dg::dda::DataDependenceAnalysis_*,_false>._M_head_impl;
  puVar1 = *(undefined8 **)(lVar8 + 0x30);
  for (puVar10 = *(undefined8 **)(lVar8 + 0x28); puVar10 != puVar1; puVar10 = puVar10 + 1) {
    puVar9 = (undefined8 *)*puVar10;
    printf("=========== fun: %s ===========\n",puVar9[6]);
    puVar2 = (undefined8 *)puVar9[1];
    for (puVar9 = (undefined8 *)*puVar9; puVar9 != puVar2; puVar9 = puVar9 + 1) {
      puVar3 = (uint *)*puVar9;
      printf("<<< bblock: %u >>>\n",(ulong)*puVar3);
      for (puVar4 = *(uint **)(puVar3 + 0xe); puVar4 != puVar3 + 0xe; puVar4 = *(uint **)puVar4) {
        pRVar5 = *(RWNode **)(puVar4 + 4);
        dumpRWNode(this,pRVar5);
        if (((graph_only[0x80] == '\0') &&
            (lVar8 = (**(code **)(*(long *)pRVar5 + 0x18))(pRVar5), *(long *)(lVar8 + 0x88) != 0))
           && (4 < *(int *)(pRVar5 + 0x90) - 6U)) {
          plVar6 = *(long **)(this->DDA->DDA)._M_t.
                             super___uniq_ptr_impl<dg::dda::DataDependenceAnalysis,_std::default_delete<dg::dda::DataDependenceAnalysis>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_dg::dda::DataDependenceAnalysis_*,_std::default_delete<dg::dda::DataDependenceAnalysis>_>
                             .super__Head_base<0UL,_dg::dda::DataDependenceAnalysis_*,_false>.
                             _M_head_impl;
          (**(code **)(*plVar6 + 0x20))(&local_48,plVar6,pRVar5);
          puVar7 = local_40;
          for (puVar11 = local_48; puVar11 != puVar7; puVar11 = puVar11 + 1) {
            pRVar5 = (RWNode *)*puVar11;
            printf("  <- ");
            printName(this,pRVar5);
            putchar(10);
          }
          if (local_48 != (undefined8 *)0x0) {
            operator_delete(local_48,local_38 - (long)local_48);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void dumpToTty() {
        for (auto *subg : DDA->getGraph()->subgraphs()) {
            printf("=========== fun: %s ===========\n",
                   subg->getName().c_str());
            for (auto *bb : subg->bblocks()) {
                printf("<<< bblock: %u >>>\n", bb->getID());
                for (auto *node : bb->getNodes()) {
                    dumpRWNode(node);
                    if (!graph_only && node->isUse() && !node->isPhi()) {
                        for (RWNode *def : DDA->getDefinitions(node)) {
                            printf("  <- ");
                            printName(def);
                            putchar('\n');
                        }
                    }
                }
            }
        }
    }